

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::
findNode<QByteArray>
          (Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *this,
          QByteArray *key)

{
  byte bVar1;
  size_t hash;
  Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *pNVar2;
  Bucket BVar3;
  QByteArrayView key_00;
  
  key_00.m_data = (key->d).ptr;
  key_00.m_size = (key->d).size;
  hash = ::qHash(key_00,this->seed);
  BVar3 = findBucketWithHash<QByteArray>(this,key,hash);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *)0x0;
  }
  else {
    pNVar2 = (Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *)
             ((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }